

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiView.cpp
# Opt level: O0

ChannelList * anon_unknown.dwarf_1b78e8::buildList(char *name,...)

{
  Channel *pCVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Channel *in_RSI;
  ChannelList *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char *channelName;
  ChannelList *list;
  undefined8 *local_138;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  Channel local_48 [16];
  uint local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined1 *local_28;
  Channel *local_20;
  undefined1 local_11;
  Channel *local_10;
  ChannelList *local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_11 = 0;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imf_3_2::ChannelList::ChannelList((ChannelList *)0x1ff013);
  local_28 = local_108;
  local_30 = (undefined8 *)&stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_20 = local_10;
  while (pCVar1 = local_20, local_20 != (Channel *)0x0) {
    Imf_3_2::Channel::Channel(local_48,HALF,1,1,false);
    Imf_3_2::ChannelList::insert((char *)in_RDI,pCVar1);
    if (local_38 < 0x29) {
      local_138 = (undefined8 *)(local_28 + (int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_138 = local_30;
      local_30 = local_30 + 1;
    }
    local_20 = (Channel *)*local_138;
  }
  return in_RDI;
}

Assistant:

ChannelList
buildList (const char* name, ...)
{
    //
    // nice function to build channel lists
    //

    ChannelList list;
    const char* channelName = name;

    va_list ap;
    va_start (ap, name);

    while (channelName != 0)
    {
        list.insert (channelName, Channel ());
        channelName = va_arg (ap, char*);
    }

    va_end (ap);
    return list;
}